

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createQuadPlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  QuadMeshNode *this_00;
  Vec3fa *pVVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  size_t sVar22;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *this_01;
  float fVar23;
  float fVar24;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  ulong local_50;
  Node *local_48;
  ulong local_40;
  Vec3fa *local_38;
  
  local_48 = (Node *)this;
  this_00 = (QuadMeshNode *)::operator_new(0xd8);
  local_58.ptr = (MaterialNode *)((material.ptr)->super_Node).super_RefCount._vptr_RefCount;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  QuadMeshNode::QuadMeshNode(this_00,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = height + 1;
  uVar16 = local_50 * (width + 1);
  uVar14 = pvVar3->size_alloced;
  uVar19 = uVar14;
  if ((uVar14 < uVar16) && (uVar18 = uVar14, uVar19 = uVar16, uVar14 != 0)) {
    for (; uVar19 = uVar18, uVar18 < uVar16; uVar18 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0)) {
    }
  }
  if (uVar16 < pvVar3->size_active) {
    pvVar3->size_active = uVar16;
  }
  if (uVar14 == uVar19) {
    pvVar3->size_active = uVar16;
  }
  else {
    local_38 = pvVar3->items;
    local_40 = uVar19;
    pVVar12 = (Vec3fa *)alignedMalloc(uVar19 << 4,0x10);
    pvVar3->items = pVVar12;
    lVar13 = 0;
    for (uVar14 = 0; uVar14 < pvVar3->size_active; uVar14 = uVar14 + 1) {
      puVar1 = (undefined8 *)((long)&local_38->field_0 + lVar13);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      lVar13 = lVar13 + 0x10;
    }
    alignedFree(local_38);
    pvVar3->size_active = uVar16;
    pvVar3->size_alloced = local_40;
  }
  this_01 = &this_00->quads;
  std::
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ::resize(this_01,height * width);
  lVar13 = 0;
  for (uVar14 = 0; uVar14 != local_50; uVar14 = uVar14 + 1) {
    fVar23 = (float)uVar14 / (float)height;
    lVar17 = lVar13;
    for (uVar19 = 0; width + 1 != uVar19; uVar19 = uVar19 + 1) {
      fVar24 = (float)uVar19 / (float)width;
      fVar5 = (dx->field_0).m128[1];
      fVar6 = (dx->field_0).m128[2];
      fVar7 = (p0->field_0).m128[1];
      fVar8 = (p0->field_0).m128[2];
      fVar9 = (dy->field_0).m128[1];
      fVar10 = (dy->field_0).m128[2];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17) =
           (dy->field_0).m128[0] * fVar23 + fVar24 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17 + 4) =
           fVar9 * fVar23 + fVar24 * fVar5 + fVar7;
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17 + 8) =
           fVar10 * fVar23 + fVar24 * fVar6 + fVar8;
      lVar17 = lVar17 + 0x10;
    }
    lVar13 = lVar13 + width * 0x10 + 0x10;
  }
  uVar14 = (ulong)((int)width + 1);
  lVar13 = 0;
  lVar17 = 0;
  sVar20 = 0;
  sVar15 = width;
  while (sVar20 != height) {
    sVar20 = sVar20 + 1;
    lVar21 = lVar17;
    for (sVar22 = 0; width != sVar22; sVar22 = sVar22 + 1) {
      iVar4 = (int)sVar22;
      *(int *)((long)&((this_01->
                       super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       )._M_impl.super__Vector_impl_data._M_start)->v0 + lVar21) =
           (int)lVar13 + iVar4;
      *(int *)((long)&((this_01->
                       super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       )._M_impl.super__Vector_impl_data._M_start)->v1 + lVar21) =
           (int)lVar13 + iVar4 + 1;
      *(int *)((long)&((this_01->
                       super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       )._M_impl.super__Vector_impl_data._M_start)->v2 + lVar21) =
           (int)sVar15 + 2 + iVar4;
      *(int *)((long)&((this_01->
                       super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       )._M_impl.super__Vector_impl_data._M_start)->v3 + lVar21) =
           (int)sVar15 + 1 + iVar4;
      lVar21 = lVar21 + 0x10;
    }
    lVar17 = lVar17 + width * 0x10;
    lVar13 = lVar13 + uVar14;
    sVar15 = sVar15 + uVar14;
  }
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_48;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createQuadPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->quads.resize(width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = y*width+x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->quads[i].v0 = unsigned(p00); 
        mesh->quads[i].v1 = unsigned(p01); 
        mesh->quads[i].v2 = unsigned(p11); 
        mesh->quads[i].v3 = unsigned(p10);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }